

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::eval_leftShift_ivec3(ShaderEvalContext *c)

{
  Vector<float,_3> local_74;
  float local_68;
  undefined8 local_64;
  Vector<float,_3> local_5c;
  _anonymous_namespace_ local_50 [12];
  Vector<float,_3> local_44;
  VecAccess<float,_4,_3> local_38;
  
  local_68 = c->in[0].m_data[2];
  local_64 = *(undefined8 *)c->in[0].m_data;
  tcu::Vector<float,_3>::cast<int>(&local_5c);
  tcu::Vector<float,_3>::cast<int>(&local_74);
  sr::(anonymous_namespace)::leftShift<int,3>
            (local_50,(Vector<int,_3> *)&local_5c,(Vector<int,_3> *)&local_74);
  tcu::Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_44);
  local_38.m_vector = &c->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,&local_44);
  return;
}

Assistant:

void eval_leftShift_int		(ShaderEvalContext& c) { c.color.x()	= (float)leftShift((int)c.in[0].z(),				(int)c.in[1].x()); }